

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NumberParser.cpp
# Opt level: O2

int __thiscall slang::parsing::NumberParser::append(NumberParser *this,Token token,bool isFirst)

{
  byte bVar1;
  bool bVar2;
  char cVar3;
  logic_t lVar4;
  uint uVar5;
  size_t sVar6;
  SourceLocation SVar7;
  size_t sVar8;
  uint maxValue;
  uint8_t *puVar9;
  byte bVar10;
  int maxValue_00;
  SourceLocation extraout_RDX;
  SourceLocation extraout_RDX_00;
  SourceLocation extraout_RDX_01;
  SourceLocation SVar11;
  SourceLocation extraout_RDX_02;
  long lVar12;
  DiagCode code;
  byte *pbVar13;
  string_view sVar14;
  Token token_local;
  Token local_40;
  
  token_local.info = token.info;
  token_local._0_8_ = token._0_8_;
  local_40 = (Token)Token::rawText(&token_local);
  SmallVectorBase<char>::append_range<std::basic_string_view<char,_std::char_traits<char>_>_>
            (&(this->text).super_SmallVectorBase<char>,
             (basic_string_view<char,_std::char_traits<char>_> *)&local_40);
  if (this->valid != true) {
    return -1;
  }
  this->valid = false;
  sVar14 = Token::rawText(&token_local);
  pbVar13 = (byte *)sVar14._M_str;
  sVar6 = sVar14._M_len;
  SVar7 = Token::location(&token_local);
  if ((sVar6 != 0 && isFirst) && (*pbVar13 == 0x5f)) {
    addDiag(this,(DiagCode)0x3,SVar7);
    return -1;
  }
  maxValue = SVar7._0_4_;
  switch(this->literalBase) {
  case Binary:
    SVar11 = SVar7;
    for (sVar8 = 0; sVar6 != sVar8; sVar8 = sVar8 + 1) {
      bVar10 = pbVar13[sVar8];
      uVar5 = bVar10 - 0x3f;
      if (uVar5 < 0x3c) {
        SVar11 = (SourceLocation)&logic_t::z;
        if ((0x800000008000001U >> ((ulong)uVar5 & 0x3f) & 1) == 0) {
          SVar11 = (SourceLocation)0x200000002000000;
          if ((0x200000002000000U >> ((ulong)uVar5 & 0x3f) & 1) == 0) goto LAB_003c4db4;
          SVar11 = (SourceLocation)&logic_t::x;
        }
        lVar4.value = *(uint8_t *)SVar11;
LAB_003c4da4:
        addDigit(this,lVar4,SVar11._0_4_);
        SVar11 = extraout_RDX;
      }
      else {
LAB_003c4db4:
        if ((bVar10 & 0xfe) == 0x30) {
          lVar4.value = bVar10 - 0x30;
          goto LAB_003c4da4;
        }
        if (bVar10 != 0x5f) {
          SVar7 = (SourceLocation)
                  ((long)((int)((ulong)SVar7 >> 0x1c) + (int)sVar8) << 0x1c |
                  (ulong)(maxValue & 0xfffffff));
          code.subsystem = Lexer;
          code.code = 0;
LAB_003c5077:
          addDiag(this,code,SVar7);
          return -1;
        }
      }
    }
    break;
  case Octal:
    SVar11 = SVar7;
    for (sVar8 = 0; sVar6 != sVar8; sVar8 = sVar8 + 1) {
      bVar10 = pbVar13[sVar8];
      uVar5 = bVar10 - 0x3f;
      if (uVar5 < 0x3c) {
        SVar11 = (SourceLocation)&logic_t::z;
        if ((0x800000008000001U >> ((ulong)uVar5 & 0x3f) & 1) == 0) {
          SVar11 = (SourceLocation)0x200000002000000;
          if ((0x200000002000000U >> ((ulong)uVar5 & 0x3f) & 1) == 0) goto LAB_003c4f53;
          SVar11 = (SourceLocation)&logic_t::x;
        }
        lVar4.value = *(uint8_t *)SVar11;
LAB_003c4f43:
        addDigit(this,lVar4,SVar11._0_4_);
        SVar11 = extraout_RDX_02;
      }
      else {
LAB_003c4f53:
        if ((bVar10 & 0xf8) == 0x30) {
          lVar4.value = bVar10 - 0x30;
          goto LAB_003c4f43;
        }
        if (bVar10 != 0x5f) {
          SVar7 = (SourceLocation)
                  ((long)((int)((ulong)SVar7 >> 0x1c) + (int)sVar8) << 0x1c |
                  (ulong)(maxValue & 0xfffffff));
          code.subsystem = Lexer;
          code.code = 3;
          goto LAB_003c5077;
        }
      }
    }
    break;
  case Decimal:
    if (isFirst) {
      if ((sVar6 == 1) && (uVar5 = *pbVar13 - 0x3f, uVar5 < 0x3c)) {
        if ((0x800000008000001U >> ((ulong)uVar5 & 0x3f) & 1) == 0) {
          if ((0x200000002000000U >> ((ulong)uVar5 & 0x3f) & 1) == 0) goto LAB_003c4fb2;
          puVar9 = &logic_t::x;
        }
        else {
          puVar9 = "@";
        }
        addDigit(this,(logic_t)*puVar9,maxValue);
        break;
      }
LAB_003c4fb2:
      if (token_local.kind == IntegerLiteral) {
        Token::intValue(&local_40);
        SVInt::operator=(&this->decimalValue,(SVInt *)&local_40);
        SVInt::~SVInt((SVInt *)&local_40);
        break;
      }
    }
    bVar10 = this->hasUnknown;
    for (sVar8 = 0; sVar6 != sVar8; sVar8 = sVar8 + 1) {
      bVar1 = pbVar13[sVar8];
      uVar5 = bVar1 - 0x3f;
      if (((uVar5 < 0x3c) && ((0xa0000000a000001U >> ((ulong)uVar5 & 0x3f) & 1) != 0)) ||
         ((byte)(bVar1 - 0x30) < 10)) {
        if ((bVar10 & 1) != 0) {
          SVar7 = (SourceLocation)
                  ((long)((int)((ulong)SVar7 >> 0x1c) + (int)sVar8) << 0x1c |
                  (ulong)(maxValue & 0xfffffff));
          code.subsystem = Lexer;
          code.code = 4;
          goto LAB_003c5077;
        }
        if ((0x3b < uVar5) ||
           (bVar10 = true, (0xa0000000a000001U >> ((ulong)uVar5 & 0x3f) & 1) == 0)) {
          bVar10 = false;
        }
        this->hasUnknown = (bool)bVar10;
      }
      else if (bVar1 != 0x5f) {
        SVar7 = (SourceLocation)
                ((long)((int)((ulong)SVar7 >> 0x1c) + (int)sVar8) << 0x1c |
                (ulong)(maxValue & 0xfffffff));
        code.subsystem = Lexer;
        code.code = 1;
        goto LAB_003c5077;
      }
    }
    break;
  case Hex:
    SVar11 = SVar7;
    for (lVar12 = 0; maxValue_00 = SVar11._0_4_, -lVar12 != sVar6; lVar12 = lVar12 + -1) {
      bVar10 = *pbVar13;
      uVar5 = bVar10 - 0x3f;
      if (uVar5 < 0x3c) {
        puVar9 = "@";
        if ((0x800000008000001U >> ((ulong)uVar5 & 0x3f) & 1) == 0) {
          if ((0x200000002000000U >> ((ulong)uVar5 & 0x3f) & 1) == 0) goto LAB_003c4e92;
          puVar9 = &logic_t::x;
        }
        lVar4.value = *puVar9;
LAB_003c4e7f:
        addDigit(this,lVar4,maxValue_00);
        SVar11 = extraout_RDX_00;
      }
      else {
LAB_003c4e92:
        bVar2 = isHexDigit(bVar10);
        maxValue_00 = extraout_RDX_01._0_4_;
        if (bVar2) {
          cVar3 = (bVar10 < 0x47) * ' ' + -0x57;
          if ((char)bVar10 < ':') {
            cVar3 = -0x30;
          }
          lVar4.value = cVar3 + bVar10;
          goto LAB_003c4e7f;
        }
        SVar11 = extraout_RDX_01;
        if (bVar10 != 0x5f) {
          if ((bVar10 == 0x2d) || (bVar10 == 0x2b)) {
            SmallVectorBase<char>::resize
                      (&(this->text).super_SmallVectorBase<char>,
                       ((this->text).super_SmallVectorBase<char>.len - sVar6) - lVar12);
            this->valid = true;
            return -(int)lVar12;
          }
          SVar7 = (SourceLocation)
                  ((long)((int)((ulong)SVar7 >> 0x1c) - (int)lVar12) << 0x1c |
                  (ulong)(maxValue & 0xfffffff));
          code.subsystem = Lexer;
          code.code = 2;
          goto LAB_003c5077;
        }
      }
      pbVar13 = pbVar13 + 1;
    }
  }
  this->valid = true;
  return -1;
}

Assistant:

int NumberParser::append(Token token, bool isFirst) {
    text.append_range(token.rawText());

    // If we've had an error thus far, don't bother doing anything else that
    // might just add more errors on the pile.
    if (!valid)
        return -1;

    // set valid to false since we return early when we encounter errors
    // if we're still good at the end of the function we'll flip this back
    valid = false;

    // underscore as the first char is not allowed
    std::string_view chars = token.rawText();
    SourceLocation location = token.location();
    if (isFirst && chars.length() && chars[0] == '_') {
        addDiag(diag::DigitsLeadingUnderscore, location);
        return -1;
    }

    int index = 0;
    switch (literalBase) {
        case LiteralBase::Binary:
            for (char c : chars) {
                if (isLogicDigit(c))
                    addDigit(getLogicCharValue(c), 2);
                else if (isBinaryDigit(c))
                    addDigit(logic_t(getDigitValue(c)), 2);
                else if (c != '_') {
                    addDiag(diag::BadBinaryDigit, location + index);
                    return -1;
                }
                index++;
            }
            break;
        case LiteralBase::Octal:
            for (char c : chars) {
                if (isLogicDigit(c))
                    addDigit(getLogicCharValue(c), 8);
                else if (isOctalDigit(c))
                    addDigit(logic_t(getDigitValue(c)), 8);
                else if (c != '_') {
                    addDiag(diag::BadOctalDigit, location + index);
                    return -1;
                }
                index++;
            }
            break;
        case LiteralBase::Decimal:
            // Decimals have the restriction that you can only use x or z if it's the only digit.
            // Further, they can obviously only have decimal numbers (not A-F letters). Combined,
            // this means that we should only ever see one token here in practice, unless there's
            // an error. Optimize for this case and just suck the decimal value that's already
            // been computed out of the token itself.
            if (isFirst) {
                if (chars.length() == 1 && isLogicDigit(chars[0])) {
                    addDigit(getLogicCharValue(chars[0]), 10);
                    break;
                }

                if (token.kind == TokenKind::IntegerLiteral) {
                    decimalValue = token.intValue();
                    break;
                }
            }

            // As mentioned above, this loop is just for checking errors.
            for (char c : chars) {
                if (isLogicDigit(c) || isDecimalDigit(c)) {
                    if (hasUnknown) {
                        addDiag(diag::DecimalDigitMultipleUnknown, location + index);
                        return -1;
                    }

                    hasUnknown = isLogicDigit(c);
                }
                else if (c != '_') {
                    addDiag(diag::BadDecimalDigit, location + index);
                    return -1;
                }
                index++;
            }
            break;
        case LiteralBase::Hex:
            for (char c : chars) {
                if (isLogicDigit(c))
                    addDigit(getLogicCharValue(c), 16);
                else if (isHexDigit(c))
                    addDigit(logic_t(getHexDigitValue(c)), 16);
                else if (c == '+' || c == '-') {
                    // This is ok, this was initially lexed as a real token with exponent.
                    // Slice off everything after and including the operator, which will
                    // become new tokens.
                    text.resize(text.size() - (chars.size() - size_t(index)));
                    valid = true;
                    return index;
                }
                else if (c != '_') {
                    addDiag(diag::BadHexDigit, location + index);
                    return -1;
                }
                index++;
            }
            break;
    }

    valid = true;
    return -1;
}